

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_free(wally_psbt *psbt)

{
  undefined8 in_RSI;
  long lVar1;
  ulong uVar2;
  
  if (psbt != (wally_psbt *)0x0) {
    wally_tx_free(psbt->tx);
    if (psbt->num_inputs != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        psbt_input_free((wally_psbt_input *)((long)&psbt->inputs->utxo + lVar1),SUB81(in_RSI,0));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x110;
      } while (uVar2 < psbt->num_inputs);
    }
    wally_free(psbt->inputs);
    if (psbt->num_outputs != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        psbt_output_free((wally_psbt_output *)((long)&psbt->outputs->redeem_script + lVar1),
                         SUB81(in_RSI,0));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0xd0;
      } while (uVar2 < psbt->num_outputs);
    }
    wally_free(psbt->outputs);
    wally_map_clear(&psbt->unknowns);
    clear_and_free(psbt,0x60);
  }
  return 0;
}

Assistant:

int wally_psbt_free(struct wally_psbt *psbt)
{
    size_t i;
    if (psbt) {
        wally_tx_free(psbt->tx);
        for (i = 0; i < psbt->num_inputs; ++i)
            psbt_input_free(&psbt->inputs[i], false);

        wally_free(psbt->inputs);
        for (i = 0; i < psbt->num_outputs; ++i)
            psbt_output_free(&psbt->outputs[i], false);

        wally_free(psbt->outputs);
        wally_map_clear(&psbt->unknowns);
        clear_and_free(psbt, sizeof(*psbt));
    }
    return WALLY_OK;
}